

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O0

void __thiscall InterleavedSudoku::permuteNumbers(InterleavedSudoku *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference __b;
  char *pcVar4;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  int local_50;
  uint local_4c;
  int y;
  int x;
  int index;
  int i_1;
  int i;
  allocator<int> local_29;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> permutation;
  InterleavedSudoku *this_local;
  
  iVar2 = (this->super_Sudoku).squared_size_;
  permutation.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_29);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,(long)iVar2,&local_29);
  std::allocator<int>::~allocator(&local_29);
  for (index = 0; index < (this->super_Sudoku).squared_size_; index = index + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)index);
    *pvVar3 = index + 1;
  }
  for (x = 0; x < (this->super_Sudoku).squared_size_; x = x + 1) {
    iVar1 = rand();
    iVar2 = (this->super_Sudoku).squared_size_;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)x);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)local_28,(long)(iVar1 % (iVar2 - x) + x));
    std::swap<int>(pvVar3,__b);
  }
  for (local_4c = 0; (int)local_4c < (this->super_Sudoku).squared_size_; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < (this->super_Sudoku).squared_size_; local_50 = local_50 + 1) {
      pcVar4 = InterleavedSudoku::index(this,(char *)(ulong)local_4c,local_50);
      p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
               operator[](&(this->super_Sudoku).fields_,(long)(int)pcVar4);
      peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var5);
      iVar2 = Field::value(peVar6);
      if (0 < iVar2) {
        pcVar4 = InterleavedSudoku::index(this,(char *)(ulong)local_4c,local_50);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](&(this->super_Sudoku).fields_,(long)(int)pcVar4);
        peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        pcVar4 = InterleavedSudoku::index(this,(char *)(ulong)local_4c,local_50);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](&(this->super_Sudoku).fields_,(long)(int)pcVar4);
        peVar7 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        iVar2 = Field::value(peVar7);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,(long)(iVar2 + -1));
        Field::setValue(peVar6,*pvVar3);
      }
      pcVar4 = InterleavedSudoku::index(this,(char *)(ulong)local_4c,local_50);
      p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
               operator[](&(this->super_Sudoku).fields_,(long)(int)pcVar4);
      peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var5);
      iVar2 = Field::value(peVar6);
      if (0 < iVar2) {
        pcVar4 = InterleavedSudoku::index(this,(char *)(ulong)local_4c,local_50);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](&(this->super_Sudoku).fields_,(long)(int)pcVar4);
        peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        pcVar4 = InterleavedSudoku::index(this,(char *)(ulong)local_4c,local_50);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](&(this->super_Sudoku).fields_,(long)(int)pcVar4);
        peVar7 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        iVar2 = Field::value(peVar7);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,(long)(iVar2 + -1));
        Field::setValue(peVar6,*pvVar3);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void InterleavedSudoku::permuteNumbers()
{
  //generate random permutation
  //srand(std::time(NULL));
  std::vector<int> permutation(squared_size_);
  for(int i=0; i<squared_size_; i++)
  {
    permutation[i] = i+1;
  }

  for(int i=0; i<squared_size_; i++)
  {
    int index = rand() % (squared_size_-i) + i;
    std::swap(permutation[i], permutation[index]);
  }

  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      if(fields_[index(x,y,0)]->value() > 0)
        fields_[index(x,y,0)]->setValue(permutation[fields_[index(x,y,0)]->value()-1]);
      if(fields_[index(x,y,1)]->value() > 0)
        fields_[index(x,y,1)]->setValue(permutation[fields_[index(x,y,1)]->value()-1]);
    }
  }
}